

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O2

void construction_worker_thread<std::pair<int,float>>
               (int number_of_threads,int thread_id,
               directed_flag_complex_in_memory_t<std::pair<int,_float>_> *result,
               directed_graph_t *graph,int max_dimension)

{
  ulong uVar1;
  unsigned_long uVar2;
  size_t offset;
  ulong uVar3;
  vector<unsigned_short,_std::allocator<unsigned_short>_> possible_vertices;
  ushort local_7e;
  int local_7c;
  long local_78;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *local_70;
  ulong local_68;
  ulong local_60;
  directed_graph_t *local_58;
  ulong local_50;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  local_68 = (ulong)graph->number_of_vertices;
  local_78 = (long)number_of_threads;
  local_60 = (ulong)thread_id;
  local_7c = max_dimension;
  local_70 = result;
  local_58 = graph;
  while (local_60 < local_68) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50 = local_60 & 0xffff;
    for (uVar3 = 0; uVar1 = local_60, uVar3 < graph->incidence_row_length; uVar3 = uVar3 + 1) {
      for (uVar2 = (graph->incidence_outgoing).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [graph->incidence_row_length * local_50 + (uVar3 & 0xffff)]; uVar2 != 0;
          uVar2 = uVar2 & ~(1L << (uVar1 & 0x3f))) {
        uVar1 = 0;
        if (uVar2 != 0) {
          for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        local_7e = (ushort)uVar1 | (ushort)(uVar3 << 6);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,&local_7e);
      }
      graph = local_58;
    }
    construct_children<std::pair<int,float>>
              ((local_70->vertex_cells).
               super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_60,graph,
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,local_7c,0);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
    local_60 = uVar1 + local_78;
  }
  return;
}

Assistant:

void construction_worker_thread(int number_of_threads, int thread_id,
                                directed_flag_complex_in_memory_t<ExtraData>* result, const directed_graph_t* graph,
                                int max_dimension) {
	const size_t number_of_vertices = graph->vertex_number();

	for (size_t index = thread_id; index < number_of_vertices; index += number_of_threads) {
		// Compute possible vertices
		std::vector<vertex_index_t> possible_vertices;
		for (size_t offset = 0; offset < graph->incidence_row_length; offset++) {
			size_t bits = graph->get_outgoing_chunk(vertex_index_t(index), vertex_index_t(offset));
			size_t vertex_offset = offset << 6;

			while (bits > 0) {
				// Get the least significant non-zero bit
				auto b = __builtin_ctzl(bits);

				// Unset this bit
				bits &= ~(ONE_ << b);
				possible_vertices.push_back(vertex_index_t(vertex_offset + b));
			}
		}
		construct_children(result->vertex_cells[index], *graph, possible_vertices, max_dimension);
	}
}